

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_union_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  uint8_t n;
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  void *pvVar4;
  char *pcVar5;
  flatcc_json_printer_union_descriptor_t ud;
  
  puVar3 = (uint8_t *)get_field_ptr(td,id + -1);
  pvVar4 = get_field_ptr(td,id);
  if (puVar3 != (uint8_t *)0x0 && pvVar4 != (void *)0x0) {
    n = *puVar3;
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar5 = ctx->p;
      ctx->p = pcVar5 + 1;
      *pcVar5 = ',';
    }
    if (ctx->indent == '\0') {
      flatcc_json_printer_flush_partial(ctx);
    }
    else {
      pcVar5 = ctx->p;
      ctx->p = pcVar5 + 1;
      *pcVar5 = '\n';
      print_indent(ctx);
    }
    *ctx->p = '\"';
    pcVar5 = ctx->p + (ctx->unquote == '\0');
    ctx->p = pcVar5;
    if (pcVar5 + len < ctx->pflush) {
      memcpy(pcVar5,name,len);
      ctx->p = ctx->p + len;
    }
    else {
      print(ctx,name,len);
    }
    print(ctx,"_type",5);
    *ctx->p = '\"';
    pcVar5 = ctx->p;
    ctx->p = pcVar5 + (ctx->unquote == '\0') + 1;
    pcVar5[ctx->unquote == '\0'] = ':';
    *ctx->p = ' ';
    pcVar5 = ctx->p;
    ctx->p = pcVar5 + (ctx->indent != '\0');
    if (ctx->noenum == '\0') {
      (*ptf)(ctx,n);
    }
    else {
      uVar2 = print_uint8(n,pcVar5 + (ctx->indent != '\0'));
      ctx->p = ctx->p + uVar2;
    }
    if (n != '\0') {
      pcVar5 = ctx->p;
      ctx->p = pcVar5 + 1;
      *pcVar5 = ',';
      print_name(ctx,name,len);
      ud.ttl = td->ttl;
      ud.member = pvVar4;
      ud.type = n;
      (*pf)(ctx,&ud);
    }
  }
  return;
}

Assistant:

void flatcc_json_printer_union_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const void *pt = get_field_ptr(td, id - 1);
    const void *p = get_field_ptr(td, id);
    utype_t type;
    flatcc_json_printer_union_descriptor_t ud;

    if (!p || !pt) {
        return;
    }
    type = __flatbuffers_utype_read_from_pe(pt);
    if (td->count++) {
        print_char(',');
    }
    print_nl();
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    if (ctx->p + len < ctx->pflush) {
        memcpy(ctx->p, name, len);
        ctx->p += len;
    } else {
        print(ctx, name, len);
    }
    print(ctx, "_type", 5);
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    print_char(':');
    print_space();
    if (ctx->noenum) {
        ctx->p += print_utype(type, ctx->p);
    } else {
        ptf(ctx, type);
    }
    if (type != 0) {
        print_char(',');
        print_name(ctx, name, len);
        ud.ttl = td->ttl;
        ud.type = type;
        ud.member = p;
        pf(ctx, &ud);
    }
}